

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_set_hflag(DisasContext *s,uint32_t mask)

{
  TCGContext *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  
  if (((uint)s->flags & mask) != 0) {
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0xb0);
  tcg_gen_ori_i32_x86_64(tcg_ctx,ret,ret,mask);
  tcg_gen_st_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0xb0);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  s->flags = s->flags | (ulong)mask;
  return;
}

Assistant:

static void gen_set_hflag(DisasContext *s, uint32_t mask)
{
    if ((s->flags & mask) == 0) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;

        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_ld_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_gen_ori_i32(tcg_ctx, t, t, mask);
        tcg_gen_st_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_temp_free_i32(tcg_ctx, t);
        s->flags |= mask;
    }
}